

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O1

RC __thiscall SM_Manager::Help(SM_Manager *this,char *relName)

{
  RC RVar1;
  RC RVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  size_t sVar3;
  DataAttrInfo *attributes;
  RC unaff_EBP;
  SM_Manager *this_00;
  int iVar4;
  bool bVar5;
  IX_IndexHandle ih;
  char *pData;
  DataAttrInfo *local_e0;
  RM_FileHandle *local_d8;
  RM_Record rec;
  Printer printer;
  RM_FileScan fs;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Help\n",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   relName=",0xb);
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12c1d8);
  }
  else {
    sVar3 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  RM_FileScan::RM_FileScan(&fs);
  RM_Record::RM_Record(&rec);
  RVar1 = RM_FileScan::OpenScan(&fs,&this->relcatFH,STRING,0x19,0,EQ_OP,relName,NO_HINT);
  if (RVar1 == 0) {
    RVar1 = RM_FileScan::GetNextRec(&fs,&rec);
    if (RVar1 == 0x6e) {
      RVar1 = 0x12e;
      RM_FileScan::CloseScan(&fs);
    }
    else {
      RM_FileScan::CloseScan(&fs);
      this_00 = (SM_Manager *)0x198;
      attributes = (DataAttrInfo *)malloc(0x198);
      SetUpAttrCatAttributes(this_00,attributes);
      local_e0 = attributes;
      Printer::Printer(&printer,attributes,6);
      Printer::PrintHeader(&printer,(ostream *)&std::cout);
      local_d8 = &this->attrcatFH;
      RVar1 = RM_FileScan::OpenScan(&fs,local_d8,STRING,0x19,0,EQ_OP,relName,NO_HINT);
      if (RVar1 == 0) {
        while (RVar2 = RM_FileScan::GetNextRec(&fs,&rec), RVar2 != 0x6e) {
          RVar2 = RM_Record::GetData(&rec,&pData);
          if (RVar2 != 0) goto LAB_0010c5c9;
          Printer::Print(&printer,(ostream *)&std::cout,pData);
        }
        RVar1 = RM_FileScan::CloseScan(&fs);
        if ((RVar1 == 0) &&
           (RVar1 = RM_FileScan::OpenScan(&fs,local_d8,STRING,0x19,0,EQ_OP,relName,NO_HINT),
           RVar1 == 0)) {
          iVar4 = 0;
          RVar1 = unaff_EBP;
          do {
            RVar2 = RM_FileScan::GetNextRec(&fs,&rec);
            if (RVar2 == 0x6e) {
              Printer::PrintFooter(&printer,(ostream *)&std::cout);
              free(local_e0);
              RVar1 = 0;
              break;
            }
            RVar2 = RM_Record::GetData(&rec,&pData);
            if (RVar2 == 0) {
              bVar5 = true;
              if ((this->printIndex == true) && (*(int *)(pData + 0x40) != -1)) {
                IX_Manager::DestroyIndex((IX_Manager *)&ih);
                IX_Manager::DestroyIndex(this->ixm);
                if (extraout_EAX == 0) {
                  IX_Manager::DestroyIndex(this->ixm);
                  bVar5 = extraout_EAX_00 == 0;
                  iVar4 = extraout_EAX_00;
                  RVar1 = unaff_EBP;
                  if (!bVar5) {
                    RVar1 = extraout_EAX_00;
                  }
                }
                else {
                  bVar5 = false;
                  iVar4 = extraout_EAX;
                  RVar1 = extraout_EAX;
                }
                IX_IndexHandle::~IX_IndexHandle(&ih);
                unaff_EBP = RVar1;
              }
            }
            else {
              bVar5 = false;
              RVar1 = iVar4;
              unaff_EBP = iVar4;
            }
          } while (bVar5);
        }
      }
LAB_0010c5c9:
      Printer::~Printer(&printer);
    }
  }
  RM_Record::~RM_Record(&rec);
  RM_FileScan::~RM_FileScan(&fs);
  return RVar1;
}

Assistant:

RC SM_Manager::Help(const char *relName)
{
    cout << "Help\n"
         << "   relName=" << relName << "\n";
  RC rc = 0;
  RM_FileScan fs;
  RM_Record rec;

  // Check that this relation exists:
  if((rc = fs.OpenScan(relcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);
  if(fs.GetNextRec(rec) == RM_EOF){
    fs.CloseScan();
    return (SM_BADRELNAME);
  }
  fs.CloseScan();
  

  // Sets up the DataAttrInfo for printing
  DataAttrInfo * attributes = (DataAttrInfo *)malloc(6* sizeof(DataAttrInfo));
  if((rc = SetUpAttrCatAttributes(attributes)))
    return (rc);
  Printer printer(attributes, 6);
  printer.PrintHeader(cout);

  // Iterate through attrcat to find all attributes
  // associated with this relation. And print them.
  if((rc = fs.OpenScan(attrcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);

  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    if((rec.GetData(pData)))
      return (rc);
    printer.Print(cout, pData);
  }

  if((rc = fs.CloseScan() ))
    return (rc);

  // If we are to print the index, itereate through again, and print
  // the entire index
  if((rc = fs.OpenScan(attrcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);
  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    if((rec.GetData(pData)))
      return (rc);
    if(printIndex){
    AttrCatEntry *attr = (AttrCatEntry*)pData;
      if((attr->indexNo != NO_INDEXES)){
        IX_IndexHandle ih;
        if((rc = ixm.OpenIndex(relName, attr->indexNo, ih)))
          return (rc);
        if((rc = ixm.CloseIndex(ih)))
          return (rc);
      }
    }
  }

  printer.PrintFooter(cout);
  free(attributes);
  return (0);
}